

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Node::Begin(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  undefined7 in_register_00000011;
  ostringstream ss;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  if ((int)CONCAT71(in_register_00000011,binary) != 0) {
    BeginBinary(this,s);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  BeginAscii(this,(ostream *)local_198,indent);
  std::__cxx11::stringbuf::str();
  StreamWriter<false,_false>::PutString(s,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void FBX::Node::Begin(
    Assimp::StreamWriterLE &s,
    bool binary, int indent
) {
    if (binary) {
        BeginBinary(s);
    } else {
        // assume we're at the correct place to start already
        (void)indent;
        std::ostringstream ss;
        BeginAscii(ss, indent);
        s.PutString(ss.str());
    }
}